

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *js,char *str)

{
  if (js == (jsparser_ctx *)0x0) {
    __assert_fail("js != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0xc5,
                  "void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *, const char *)"
                 );
  }
  if (str == (char *)0x0) {
    __assert_fail("str != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0xc6,
                  "void ctemplate_htmlparser::jsparser_buffer_append_str(jsparser_ctx *, const char *)"
                 );
  }
  for (; *str != '\0'; str = str + 1) {
    jsparser_buffer_append_chr(js,*str);
  }
  return;
}

Assistant:

void jsparser_buffer_append_str(jsparser_ctx *js, const char *str)
{
  assert(js != NULL);
  assert(str != NULL);

  while(*str != '\0') {
    jsparser_buffer_append_chr(js, *str++);
  }
}